

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifReduce.c
# Opt level: O3

void If_ManImproveNodeUpdate(If_Man_t *p,If_Obj_t *pObj,Vec_Ptr_t *vFront)

{
  If_Cut_t *pCut;
  uint uVar1;
  void **ppvVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  
  pCut = &pObj->CutBest;
  If_CutAreaDeref(p,pCut);
  (pObj->CutBest).field_0x1f = (char)vFront->nSize;
  if (0 < vFront->nSize) {
    ppvVar2 = vFront->pArray;
    lVar4 = 0;
    do {
      *(undefined4 *)(&pObj[1].field_0x0 + lVar4 * 4) = *(undefined4 *)((long)ppvVar2[lVar4] + 4);
      lVar4 = lVar4 + 1;
    } while (lVar4 < vFront->nSize);
  }
  If_CutOrder(pCut);
  uVar1 = *(uint *)&(pObj->CutBest).field_0x1c;
  uVar3 = 0;
  if (0xffffff < uVar1) {
    uVar5 = 0;
    uVar3 = 0;
    do {
      uVar3 = uVar3 | 1 << *(uint *)(&pObj[1].field_0x0 + uVar5 * 4) % 0x1f;
      uVar5 = uVar5 + 1;
    } while (uVar1 >> 0x18 != uVar5);
  }
  (pObj->CutBest).uSign = uVar3;
  If_CutAreaRef(p,pCut);
  return;
}

Assistant:

void If_ManImproveNodeUpdate( If_Man_t * p, If_Obj_t * pObj, Vec_Ptr_t * vFront )
{
    If_Cut_t * pCut;
    If_Obj_t * pFanin;
    int i;
    pCut = If_ObjCutBest(pObj);
    // deref node's cut
    If_CutAreaDeref( p, pCut );
    // update the node's cut
    pCut->nLeaves = Vec_PtrSize(vFront);
    Vec_PtrForEachEntry( If_Obj_t *, vFront, pFanin, i )
        pCut->pLeaves[i] = pFanin->Id;
    If_CutOrder( pCut );
    pCut->uSign = If_ObjCutSignCompute(pCut);
    // ref the new cut
    If_CutAreaRef( p, pCut );
}